

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
             *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  char *in_RCX;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_38;
  
  if (*(long *)(this + 0x10) != 0) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>>
              (&local_38,*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8),
               (char *)(*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8) +
                       *(long *)(this + 0x10)),in_RCX,*it);
    *(ulong *)((long)&(it->super_truncating_iterator_base<char_*>).limit_ + 1) =
         CONCAT17((undefined1)local_38.super_truncating_iterator_base<char_*>.count_,
                  local_38.super_truncating_iterator_base<char_*>.limit_._1_7_);
    *(undefined8 *)((long)&(it->super_truncating_iterator_base<char_*>).count_ + 1) =
         local_38._17_8_;
    (it->super_truncating_iterator_base<char_*>).out_ =
         local_38.super_truncating_iterator_base<char_*>.out_;
    (it->super_truncating_iterator_base<char_*>).limit_ =
         CONCAT71(local_38.super_truncating_iterator_base<char_*>.limit_._1_7_,
                  (undefined1)local_38.super_truncating_iterator_base<char_*>.limit_);
  }
  std::
  __fill_n_a1<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
            (&local_38,*it,*(unsigned_long *)(this + 0x20),(char *)(this + 0x18));
  *(ulong *)((long)&(it->super_truncating_iterator_base<char_*>).limit_ + 1) =
       CONCAT17((undefined1)local_38.super_truncating_iterator_base<char_*>.count_,
                local_38.super_truncating_iterator_base<char_*>.limit_._1_7_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<char_*>).count_ + 1) = local_38._17_8_;
  (it->super_truncating_iterator_base<char_*>).out_ =
       local_38.super_truncating_iterator_base<char_*>.out_;
  (it->super_truncating_iterator_base<char_*>).limit_ =
       CONCAT71(local_38.super_truncating_iterator_base<char_*>.limit_._1_7_,
                (undefined1)local_38.super_truncating_iterator_base<char_*>.limit_);
  int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
            ((dec_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }